

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ikfast.h
# Opt level: O0

void __thiscall ikfast::IkSolution<double>::Validate(IkSolution<double> *this)

{
  byte bVar1;
  size_type sVar2;
  const_reference pvVar3;
  runtime_error *prVar4;
  ulong local_18;
  size_t i;
  IkSolution<double> *this_local;
  
  local_18 = 0;
  while( true ) {
    sVar2 = std::
            vector<ikfast::IkSingleDOFSolutionBase<double>,_std::allocator<ikfast::IkSingleDOFSolutionBase<double>_>_>
            ::size(&this->_vbasesol);
    if (sVar2 <= local_18) {
      return;
    }
    pvVar3 = std::
             vector<ikfast::IkSingleDOFSolutionBase<double>,_std::allocator<ikfast::IkSingleDOFSolutionBase<double>_>_>
             ::operator[](&this->_vbasesol,local_18);
    if (pvVar3->maxsolutions == 0xff) break;
    pvVar3 = std::
             vector<ikfast::IkSingleDOFSolutionBase<double>,_std::allocator<ikfast::IkSingleDOFSolutionBase<double>_>_>
             ::operator[](&this->_vbasesol,local_18);
    if (pvVar3->maxsolutions != '\0') {
      pvVar3 = std::
               vector<ikfast::IkSingleDOFSolutionBase<double>,_std::allocator<ikfast::IkSingleDOFSolutionBase<double>_>_>
               ::operator[](&this->_vbasesol,local_18);
      bVar1 = pvVar3->indices[0];
      pvVar3 = std::
               vector<ikfast::IkSingleDOFSolutionBase<double>,_std::allocator<ikfast::IkSingleDOFSolutionBase<double>_>_>
               ::operator[](&this->_vbasesol,local_18);
      if (pvVar3->maxsolutions <= bVar1) {
        prVar4 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::runtime_error::runtime_error(prVar4,"index >= max solutions for joint");
        __cxa_throw(prVar4,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      pvVar3 = std::
               vector<ikfast::IkSingleDOFSolutionBase<double>,_std::allocator<ikfast::IkSingleDOFSolutionBase<double>_>_>
               ::operator[](&this->_vbasesol,local_18);
      if (pvVar3->indices[1] != 0xff) {
        pvVar3 = std::
                 vector<ikfast::IkSingleDOFSolutionBase<double>,_std::allocator<ikfast::IkSingleDOFSolutionBase<double>_>_>
                 ::operator[](&this->_vbasesol,local_18);
        bVar1 = pvVar3->indices[1];
        pvVar3 = std::
                 vector<ikfast::IkSingleDOFSolutionBase<double>,_std::allocator<ikfast::IkSingleDOFSolutionBase<double>_>_>
                 ::operator[](&this->_vbasesol,local_18);
        if (pvVar3->maxsolutions <= bVar1) {
          prVar4 = (runtime_error *)__cxa_allocate_exception(0x10);
          std::runtime_error::runtime_error(prVar4,"2nd index >= max solutions for joint");
          __cxa_throw(prVar4,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
        }
      }
    }
    local_18 = local_18 + 1;
  }
  prVar4 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(prVar4,"max solutions for joint not initialized");
  __cxa_throw(prVar4,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

virtual void Validate() const {
        for(size_t i = 0; i < _vbasesol.size(); ++i) {
            if( _vbasesol[i].maxsolutions == (unsigned char)-1) {
                throw std::runtime_error("max solutions for joint not initialized");
            }
            if( _vbasesol[i].maxsolutions > 0 ) {
                if( _vbasesol[i].indices[0] >= _vbasesol[i].maxsolutions ) {
                    throw std::runtime_error("index >= max solutions for joint");
                }
                if( _vbasesol[i].indices[1] != (unsigned char)-1 && _vbasesol[i].indices[1] >= _vbasesol[i].maxsolutions ) {
                    throw std::runtime_error("2nd index >= max solutions for joint");
                }
            }
        }
    }